

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_impl.hpp
# Opt level: O2

error_code __thiscall
websocketpp::connection<websocketpp::config::asio>::send_close_frame
          (connection<websocketpp::config::asio> *this,value code,string *reason,bool ack,
          bool terminal)

{
  mutex_type *__mutex;
  ushort uVar1;
  basic<websocketpp::concurrency::basic,_websocketpp::log::alevel> *pbVar2;
  element_type *peVar3;
  timer_handler *callback;
  _Elt_pointer psVar4;
  _Elt_pointer psVar5;
  uint uVar6;
  ostream *poVar7;
  error_category *peVar8;
  undefined7 in_register_00000009;
  size_t __n;
  error_category *extraout_RDX;
  undefined6 in_register_00000032;
  ulong uVar9;
  error_code eVar10;
  message_ptr msg;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  element_type *local_238;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_230;
  __shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
  local_228;
  __shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
  local_218;
  undefined1 local_208 [16];
  dispatch_handler local_1f8;
  _Function_base local_1d8;
  stringstream s;
  ostream local_1a8 [376];
  
  __n = CONCAT71(in_register_00000009,ack);
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
            ((this->m_alog).
             super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,0x400,"send_close_frame",__n);
  if ((int)CONCAT62(in_register_00000032,code) == 0) {
    if (ack) {
      pbVar2 = (this->m_alog).
               super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      if (this->m_remote_close_code != 0x3ed) {
        log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
                  (pbVar2,0x400,"acknowledging with remote codes",__n);
        this->m_local_close_code = this->m_remote_close_code;
        goto LAB_001b18e4;
      }
      log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
                (pbVar2,0x400,"acknowledging a no-status close with normal code",__n);
      this->m_local_close_code = 1000;
    }
    else {
      log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
                ((this->m_alog).
                 super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,0x400,"closing with no status code",__n);
      this->m_local_close_code = 0x3ed;
    }
    (this->m_local_close_reason)._M_string_length = 0;
    *(this->m_local_close_reason)._M_dataplus._M_p = '\0';
  }
  else {
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              ((this->m_alog).
               super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,0x400,"closing with specified codes",__n);
    this->m_local_close_code = code;
LAB_001b18e4:
    std::__cxx11::string::_M_assign((string *)&this->m_local_close_reason);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&s);
  poVar7 = std::operator<<(local_1a8,"Closing with code: ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->m_local_close_code);
  poVar7 = std::operator<<(poVar7,", and reason: ");
  std::operator<<(poVar7,(string *)&this->m_local_close_reason);
  pbVar2 = (this->m_alog).
           super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::__cxx11::stringbuf::str();
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
            (pbVar2,0x400,local_248,__n);
  std::__cxx11::string::~string((string *)local_248);
  message_buffer::alloc::
  con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
  ::get_message((con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
                 *)&msg);
  if (msg.
      super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    peVar8 = error::get_category();
    uVar9 = 7;
  }
  else {
    peVar3 = (this->m_processor).
             super___shared_ptr<websocketpp::processor::processor<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    uVar1 = this->m_local_close_code;
    std::
    __shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_218,
                   &msg.
                    super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
                  );
    uVar6 = (*peVar3->_vptr_processor[0x16])
                      (peVar3,(ulong)uVar1,&this->m_local_close_reason,&local_218);
    uVar9 = (ulong)uVar6;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_218._M_refcount);
    peVar8 = extraout_RDX;
    if (uVar6 == 0) {
      if (terminal) {
        (msg.
         super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->m_terminal = true;
      }
      this->m_state = closing;
      if (ack) {
        this->m_was_clean = true;
      }
      callback = (timer_handler *)this->m_close_handshake_timeout_dur;
      if (0 < (long)callback) {
        get_shared((connection<websocketpp::config::asio> *)local_208);
        local_248._0_8_ = handle_close_handshake_timeout;
        local_248._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_238 = (element_type *)local_208._0_8_;
        _Stack_230._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_;
        local_208 = ZEXT816(0) << 0x20;
        std::function<void(std::error_code_const&)>::
        function<std::_Bind<void(websocketpp::connection<websocketpp::config::asio>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>>,std::_Placeholder<1>))(std::error_code_const&)>,void>
                  ((function<void(std::error_code_const&)> *)&local_1d8,
                   (_Bind<void_(websocketpp::connection<websocketpp::config::asio>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_std::_Placeholder<1>))(const_std::error_code_&)>
                    *)local_248);
        transport::asio::connection<websocketpp::config::asio::transport_config>::set_timer
                  ((connection<websocketpp::config::asio::transport_config> *)local_258,(long)this,
                   callback);
        std::
        __shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_(__gnu_cxx::_Lock_policy)2>
        ::operator=(&(this->m_handshake_timer).
                     super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_(__gnu_cxx::_Lock_policy)2>
                    ,(__shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_(__gnu_cxx::_Lock_policy)2>
                      *)local_258);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_258 + 8));
        std::_Function_base::~_Function_base(&local_1d8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_230);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 8));
      }
      __mutex = &this->m_write_lock;
      std::mutex::lock(__mutex);
      std::
      __shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr(&local_228,
                     &msg.
                      super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
                    );
      write_push(this,(message_ptr *)&local_228);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_228._M_refcount);
      if (this->m_write_flag == false) {
        psVar4 = (this->m_send_queue).c.
                 super__Deque_base<std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_std::allocator<std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        psVar5 = (this->m_send_queue).c.
                 super__Deque_base<std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_std::allocator<std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        if (psVar4 != psVar5) {
          get_shared((connection<websocketpp::config::asio> *)local_258);
          local_248._0_8_ = write_frame;
          local_248._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_238 = (element_type *)local_258._0_8_;
          _Stack_230._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_;
          local_258 = ZEXT816(0) << 0x20;
          std::function<void()>::
          function<std::_Bind<void(websocketpp::connection<websocketpp::config::asio>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>>))()>,void>
                    ((function<void()> *)(local_208 + 0x10),
                     (_Bind<void_(websocketpp::connection<websocketpp::config::asio>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>))()>
                      *)local_248);
          transport::asio::connection<websocketpp::config::asio::transport_config>::dispatch
                    (&this->super_transport_con_type,(dispatch_handler *)(local_208 + 0x10));
          std::_Function_base::~_Function_base((_Function_base *)(local_208 + 0x10));
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_230);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_258 + 8));
        }
      }
      else {
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      }
      uVar9 = 0;
      peVar8 = (error_category *)std::_V2::system_category();
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&msg.
              super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::stringstream::~stringstream((stringstream *)&s);
  eVar10._M_cat = peVar8;
  eVar10._0_8_ = uVar9;
  return eVar10;
}

Assistant:

lib::error_code connection<config>::send_close_frame(close::status::value code,
    std::string const & reason, bool ack, bool terminal)
{
    m_alog->write(log::alevel::devel,"send_close_frame");

    // check for special codes

    // If silent close is set, respect it and blank out close information
    // Otherwise use whatever has been specified in the parameters. If
    // parameters specifies close::status::blank then determine what to do
    // based on whether or not this is an ack. If it is not an ack just
    // send blank info. If it is an ack then echo the close information from
    // the remote endpoint.
    if (config::silent_close) {
        m_alog->write(log::alevel::devel,"closing silently");
        m_local_close_code = close::status::no_status;
        m_local_close_reason.clear();
    } else if (code != close::status::blank) {
        m_alog->write(log::alevel::devel,"closing with specified codes");
        m_local_close_code = code;
        m_local_close_reason = reason;
    } else if (!ack) {
        m_alog->write(log::alevel::devel,"closing with no status code");
        m_local_close_code = close::status::no_status;
        m_local_close_reason.clear();
    } else if (m_remote_close_code == close::status::no_status) {
        m_alog->write(log::alevel::devel,
            "acknowledging a no-status close with normal code");
        m_local_close_code = close::status::normal;
        m_local_close_reason.clear();
    } else {
        m_alog->write(log::alevel::devel,"acknowledging with remote codes");
        m_local_close_code = m_remote_close_code;
        m_local_close_reason = m_remote_close_reason;
    }

    std::stringstream s;
    s << "Closing with code: " << m_local_close_code << ", and reason: "
      << m_local_close_reason;
    m_alog->write(log::alevel::devel,s.str());

    message_ptr msg = m_msg_manager->get_message();
    if (!msg) {
        return error::make_error_code(error::no_outgoing_buffers);
    }

    lib::error_code ec = m_processor->prepare_close(m_local_close_code,
        m_local_close_reason,msg);
    if (ec) {
        return ec;
    }

    // Messages flagged terminal will result in the TCP connection being dropped
    // after the message has been written. This is typically used when servers
    // send an ack and when any endpoint encounters a protocol error
    if (terminal) {
        msg->set_terminal(true);
    }

    m_state = session::state::closing;

    if (ack) {
        m_was_clean = true;
    }

    // Start a timer so we don't wait forever for the acknowledgement close
    // frame
    if (m_close_handshake_timeout_dur > 0) {
        m_handshake_timer = transport_con_type::set_timer(
            m_close_handshake_timeout_dur,
            lib::bind(
                &type::handle_close_handshake_timeout,
                type::get_shared(),
                lib::placeholders::_1
            )
        );
    }

    bool needs_writing = false;
    {
        scoped_lock_type lock(m_write_lock);
        write_push(msg);
        needs_writing = !m_write_flag && !m_send_queue.empty();
    }

    if (needs_writing) {
        transport_con_type::dispatch(lib::bind(
            &type::write_frame,
            type::get_shared()
        ));
    }

    return lib::error_code();
}